

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O2

void __thiscall
capnp::_::RpcSystemBase::RpcConnectionState::disconnect
          (RpcConnectionState *this,Exception *exception)

{
  uint *puVar1;
  int line;
  uint uVar2;
  size_t sVar3;
  char *file;
  Impl *impl;
  Canceler *this_00;
  SourceLocation location;
  Connection *connection;
  size_t in_RCX;
  StringPtr *params;
  anon_class_16_2_189108fc *func;
  anon_class_24_3_4d11cdf1 *func_00;
  kj *this_01;
  Exception *newException;
  long lVar4;
  Canceler *ptrCopy;
  StringPtr value;
  Canceler *ptrCopy_1;
  undefined1 local_700 [16];
  Connection *pCStack_6f0;
  undefined8 *local_6e0;
  PromiseBase local_6d8;
  undefined1 local_6d0 [64];
  NullableValue<kj::Exception> _newException549;
  Promise<void> shutdownPromise;
  Exception networkException;
  NullableValue<kj::Exception> local_1c8;
  
  if ((this->connection).tag == 1) {
    sVar3 = (exception->description).content.size_;
    if (sVar3 == 0) {
      this_01 = (kj *)0x4706a1;
    }
    else {
      this_01 = (kj *)(exception->description).content.ptr;
    }
    file = exception->file;
    line = exception->line;
    value.content.ptr = (char *)(sVar3 + (sVar3 == 0));
    value.content.size_ = in_RCX;
    kj::heapString((String *)(local_6d0 + 0x28),this_01,value);
    kj::Exception::Exception(&networkException,DISCONNECTED,file,line,(String *)(local_6d0 + 0x28));
    kj::Array<char>::~Array((Array<char> *)(local_6d0 + 0x28));
    if (1 < (exception->remoteTrace).content.size_) {
      shutdownPromise.super_PromiseBase.node.ptr = (PromiseBase)(exception->remoteTrace).content.ptr
      ;
      kj::str<kj::StringPtr>((String *)&_newException549,(kj *)&shutdownPromise,params);
      kj::Array<char>::operator=
                (&networkException.remoteTrace.content,(Array<char> *)&_newException549);
      kj::Array<char>::~Array((Array<char> *)&_newException549);
    }
    uVar2 = exception->traceCount;
    for (lVar4 = 0; (ulong)uVar2 << 3 != lVar4; lVar4 = lVar4 + 8) {
      kj::Exception::addTrace(&networkException,*(void **)((long)exception->trace + lVar4));
    }
    kj::Exception::addTraceHere(&networkException);
    impl = *(Impl **)&(this->connection).field_1;
    local_700._8_8_ = *(undefined8 *)((long)&(this->connection).field_1 + 8);
    pCStack_6f0 = *(Connection **)((long)&(this->connection).field_1 + 0x10);
    *(undefined8 *)((long)&(this->connection).field_1 + 0x10) = 0;
    local_6e0 = *(undefined8 **)((long)&(this->connection).field_1 + 0x18);
    this_00 = *(Canceler **)((long)&(this->connection).field_1 + 0x20);
    *(undefined8 *)((long)&(this->connection).field_1 + 0x20) = 0;
    kj::Exception::Exception((Exception *)&_newException549,&networkException);
    kj::OneOf<capnp::_::RpcSystemBase::RpcConnectionState::Connected,kj::Exception>::
    init<kj::Exception,kj::Exception>
              ((OneOf<capnp::_::RpcSystemBase::RpcConnectionState::Connected,kj::Exception> *)
               &this->connection,(Exception *)&_newException549);
    kj::Exception::~Exception((Exception *)&_newException549);
    local_6d0._0_8_ = this;
    local_6d0._8_8_ = (RpcConnectionState *)&networkException;
    kj::
    runCatchingExceptions<capnp::_::RpcSystemBase::RpcConnectionState::disconnect(kj::Exception&&)::_lambda()_2_>
              ((Maybe<kj::Exception> *)&shutdownPromise,(kj *)local_6d0,func);
    kj::_::NullableValue<kj::Exception>::NullableValue
              (&_newException549,(NullableValue<kj::Exception> *)&shutdownPromise);
    kj::_::NullableValue<kj::Exception>::~NullableValue
              ((NullableValue<kj::Exception> *)&shutdownPromise);
    if ((_newException549.isSet == true) && (kj::_::Debug::minSeverity < 3)) {
      kj::_::Debug::log<char_const(&)[71],kj::Exception&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc.c++"
                 ,0x229,ERROR,
                 "\"Uncaught exception when destroying capabilities dropped by disconnect.\", newException"
                 ,(char (*) [71])
                  "Uncaught exception when destroying capabilities dropped by disconnect.",
                 &_newException549.field_1.value);
    }
    kj::_::NullableValue<kj::Exception>::~NullableValue(&_newException549);
    if (this->idle == false) {
      _newException549._0_8_ = local_700 + 8;
      _newException549.field_1.value.ownFile.content.ptr = (char *)exception;
      _newException549.field_1.value.ownFile.content.size_ = (size_t)this;
      kj::
      runCatchingExceptions<capnp::_::RpcSystemBase::RpcConnectionState::disconnect(kj::Exception&&)::_lambda()_3_>
                ((Maybe<kj::Exception> *)&local_1c8,(kj *)&_newException549,func_00);
      kj::_::NullableValue<kj::Exception>::~NullableValue(&local_1c8);
    }
    connection = pCStack_6f0;
    (*pCStack_6f0->_vptr_Connection[2])(local_700,pCStack_6f0);
    kj::Promise<void>::attach<kj::Own<capnp::_::VatNetworkBase::Connection,decltype(nullptr)>>
              ((Promise<void> *)local_6d0,
               (Own<capnp::_::VatNetworkBase::Connection,_std::nullptr_t> *)local_700);
    puVar1 = &(this->super_Refcounted).refcount;
    *puVar1 = *puVar1 + 1;
    _newException549._0_8_ = &this->super_Refcounted;
    _newException549.field_1.value.ownFile.content.ptr = (char *)this;
    kj::Exception::Exception
              ((Exception *)&_newException549.field_1.value.ownFile.content.size_,exception);
    local_6d0._16_8_ =
         "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc.c++"
    ;
    local_6d0._24_8_ = "disconnect";
    local_6d0._32_8_ = (ArrayDisposer *)0x1c00000239;
    location.function = "disconnect";
    location.fileName =
         "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc.c++"
    ;
    location.lineNumber = 0x239;
    location.columnNumber = 0x1c;
    kj::Promise<void>::
    catch_<capnp::_::RpcSystemBase::RpcConnectionState::disconnect(kj::Exception&&)::_lambda(kj::Exception&&)_1_>
              (&shutdownPromise,(anon_class_416_2_7e3683e4_for_errorHandler *)local_6d0,location);
    disconnect(kj::Exception&&)::{lambda(kj::Exception&&)#1}::~Exception
              ((_lambda_kj__Exception____1_ *)&_newException549);
    kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)local_6d0);
    kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)local_700);
    kj::Canceler::cancel(this_00,&networkException);
    local_6d8.node.ptr = (OwnPromiseNode)(OwnPromiseNode)shutdownPromise.super_PromiseBase.node.ptr;
    shutdownPromise.super_PromiseBase.node.ptr = (PromiseBase)(OwnPromiseNode)0x0;
    dropConnection(impl,connection,(Promise<void> *)&local_6d8);
    kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_6d8.node);
    kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&shutdownPromise);
    (**(code **)*local_6e0)(local_6e0,this_00);
    kj::Own<capnp::_::VatNetworkBase::Connection,_std::nullptr_t>::dispose
              ((Own<capnp::_::VatNetworkBase::Connection,_std::nullptr_t> *)(local_700 + 8));
    kj::Exception::~Exception(&networkException);
  }
  (this->traceEncoder).ptr = (Function<kj::String_(const_kj::Exception_&)> *)0x0;
  return;
}

Assistant:

void disconnect(kj::Exception&& exception) {
    // Shut down the connection with the given error.
    //
    // This will cancel `tasks`, so cannot be called from inside a task in `tasks`. Instead, use
    // `tasks.add(exception)` to schedule a shutdown, since any error thrown by a task will be
    // passed to `disconnect()` later.

    // After disconnect(), the RpcSystem could be destroyed, making `traceEncoder` a dangling
    // reference, so null it out before we return from here. We don't need it anymore once
    // disconnected anyway.
    KJ_DEFER(traceEncoder = kj::none);

    if (!connection.is<Connected>()) {
      // Already disconnected.
      return;
    }

    kj::Exception networkException(kj::Exception::Type::DISCONNECTED,
        exception.getFile(), exception.getLine(), kj::heapString(exception.getDescription()));

    // Don't throw away the stack trace.
    if (exception.getRemoteTrace() != nullptr) {
      networkException.setRemoteTrace(kj::str(exception.getRemoteTrace()));
    }
    for (void* addr: exception.getStackTrace()) {
      networkException.addTrace(addr);
    }
    // If your stack trace points here, it means that the exception became the reason that the
    // RPC connection was disconnected. The exception was then thrown by all in-flight calls and
    // all future calls on this connection.
    networkException.addTraceHere();

    // Set our connection state to Disconnected now so that no one tries to write any messages to
    // it in their destructors.
    auto& rpcSystem = connection.get<Connected>().rpcSystem;
    auto dyingConnection = kj::mv(connection.get<Connected>().connection);
    auto canceler = kj::mv(connection.get<Connected>().canceler);
    connection.init<Disconnected>(kj::cp(networkException));

    KJ_IF_SOME(newException, kj::runCatchingExceptions([&]() {
      // Carefully pull all the objects out of the tables prior to releasing them because their
      // destructors could come back and mess with the tables.
      kj::Vector<kj::Own<PipelineHook>> pipelinesToRelease;
      kj::Vector<kj::Own<ClientHook>> clientsToRelease;
      kj::Vector<decltype(Answer::task)> tasksToRelease;
      kj::Vector<kj::Promise<void>> resolveOpsToRelease;
      KJ_DEFER(tasks.clear());

      // All current questions complete with exceptions.
      questions.forEach([&](QuestionId id, Question& question) {
        KJ_IF_SOME(questionRef, question.selfRef) {
          // QuestionRef still present.
          questionRef.reject(kj::cp(networkException));

          // We need to fully disconnect each QuestionRef otherwise it holds a reference back to
          // the connection state. Meanwhile `tasks` may hold streaming calls that end up holding
          // these QuestionRefs. Technically this is a cyclic reference, but as long as the cycle
          // is broken on disconnect (which happens when the RpcSystem itself is destroyed), then
          // we're OK.
          questionRef.disconnect();
        }
      });
      // Since we've disconnected the QuestionRefs, they won't clean up the questions table for
      // us, so do that here.
      questions.release();

      answers.forEach([&](AnswerId id, Answer& answer) {
        KJ_IF_SOME(p, answer.pipeline) {
          pipelinesToRelease.add(kj::mv(p));
        }

        tasksToRelease.add(kj::mv(answer.task));

        KJ_IF_SOME(context, answer.callContext) {
          context.finish();
        }
      });

      exports.forEach([&](ExportId id, Export& exp) {
        clientsToRelease.add(kj::mv(exp.clientHook));
        KJ_IF_SOME(op, exp.resolveOp) {
          resolveOpsToRelease.add(kj::mv(op));
        }
        exp = Export();
      });

      imports.forEach([&](ImportId id, Import& import) {
        KJ_IF_SOME(f, import.promiseFulfiller) {
          f->reject(kj::cp(networkException));
        }
      });

      embargoes.forEach([&](EmbargoId id, Embargo& embargo) {
        KJ_IF_SOME(f, embargo.fulfiller) {
          f->reject(kj::cp(networkException));
        }
      });
    })) {
      // Some destructor must have thrown an exception.  There is no appropriate place to report
      // these errors.
      KJ_LOG(ERROR, "Uncaught exception when destroying capabilities dropped by disconnect.",
             newException);
    }

    // Send an abort message, but ignore failure. Don't send if idle, because we promised not to
    // send any more messages in that case... we'll just disconnect.
    if (!idle) {
      kj::runCatchingExceptions([&]() {
        auto message = dyingConnection->newOutgoingMessage(
            messageSizeHint<void>() + exceptionSizeHint(exception));
        fromException(exception, message->getBody().getAs<rpc::Message>().initAbort());
        message->send();
      });
    }

    // Indicate disconnect.
    auto& dyingConnectionRef = *dyingConnection;
    auto shutdownPromise = dyingConnection->shutdown()
        .attach(kj::mv(dyingConnection))
        .catch_([self = kj::addRef(*this), origException = kj::mv(exception)](
                  kj::Exception&& shutdownException) -> kj::Promise<void> {
          // Don't report disconnects as an error.
          if (shutdownException.getType() == kj::Exception::Type::DISCONNECTED) {
            return kj::READY_NOW;
          }
          // If the error is just what was passed in to disconnect(), don't report it back out
          // since it shouldn't be anything the caller doesn't already know about.
          if (shutdownException.getType() == origException.getType() &&
              shutdownException.getDescription() == origException.getDescription()) {
            return kj::READY_NOW;
          }
          // We are shutting down after receive error, ignore shutdown exception since underlying
          // transport is probably broken.
          if (self->receiveIncomingMessageError) {
            return kj::READY_NOW;
          }
          return kj::mv(shutdownException);
        });
    canceler->cancel(networkException);
    RpcSystemBase::dropConnection(rpcSystem, dyingConnectionRef, kj::mv(shutdownPromise));
  }